

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O3

void ncnn::conv_im2col_sgemm_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,int kernel_w,int kernel_h,int stride_w,
               int stride_h,Mat *_bias,vector<float,_std::allocator<float>_> *scale_requant,
               Option *opt)

{
  int *piVar1;
  float fVar2;
  size_t sVar3;
  size_t sVar4;
  pointer pfVar5;
  int *piVar6;
  undefined1 *puVar7;
  Allocator *pAVar8;
  uint uVar9;
  uint uVar10;
  void *__ptr;
  void *pvVar11;
  char *pcVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  float fVar16;
  uint uVar17;
  long lVar18;
  void *pvVar19;
  char *pcVar20;
  ulong uVar21;
  void *pvVar22;
  long lVar23;
  undefined4 *puVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  void *pvVar28;
  int iVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  undefined1 *puVar33;
  void *pvVar34;
  long lVar35;
  void *pvVar36;
  int p;
  ulong uVar37;
  char *pcVar38;
  void *pvVar39;
  undefined1 *puVar40;
  char *ret;
  int iVar41;
  char *input;
  ulong uVar42;
  char *pcVar43;
  undefined4 uVar44;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar45 [12];
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined4 uVar48;
  int sum3 [4];
  int sum2 [4];
  int sum1 [4];
  void *local_1c0;
  void *local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  ulong local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined4 uStack_17c;
  undefined8 local_178;
  float fStack_170;
  float fStack_16c;
  ulong local_160;
  undefined8 local_158;
  long local_148;
  uint local_140;
  float local_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  int *local_108;
  int *local_100;
  char *local_f8;
  undefined1 *local_f0;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  Allocator *local_b8;
  Allocator *local_b0;
  ulong local_a8;
  char *local_a0;
  int local_98 [12];
  int *local_68;
  Mat *local_60;
  ulong local_58;
  ulong local_50;
  char *local_48;
  char *local_40;
  Allocator *local_38;
  
  uVar42 = (ulong)(uint)stride_w;
  uVar30 = bottom_blob->w;
  local_178 = (ulong)(uint)bottom_blob->c;
  local_118 = (float)top_blob->h;
  local_e8 = (float)(kernel_h * kernel_w);
  uVar13 = bottom_blob->c * (int)local_e8;
  local_158 = (void *)CONCAT44(local_158._4_4_,top_blob->w);
  uVar9 = (int)local_118 * top_blob->w;
  local_160 = (ulong)top_blob->c;
  local_b8 = opt->workspace_allocator;
  local_d8 = _kernel;
  local_60 = top_blob;
  if (uVar9 * uVar13 == 0) {
    local_100 = (int *)0x0;
    __ptr = (void *)0x0;
  }
  else {
    local_188 = CONCAT44(local_188._4_4_,stride_w);
    uVar42 = (long)(int)(uVar9 * uVar13) + 3U & 0xfffffffffffffffc;
    if (local_b8 == (Allocator *)0x0) {
      local_1a8 = (void *)0x0;
      iVar29 = posix_memalign((void **)&local_1a8,0x10,uVar42 + 4);
      __ptr = (void *)0x0;
      if (iVar29 == 0) {
        __ptr = local_1a8;
      }
    }
    else {
      __ptr = (void *)(**(code **)(*(long *)local_b8 + 0x10))();
    }
    local_100 = (int *)((long)__ptr + uVar42);
    *(undefined4 *)((long)__ptr + uVar42) = 1;
    uVar42 = local_188 & 0xffffffff;
  }
  if (0 < (int)local_118) {
    local_190 = (ulong)(stride_h * uVar30);
    local_128._0_8_ = uVar42;
    lVar27 = 0;
    iVar29 = 0;
    fVar16 = 0.0;
    do {
      local_138._0_4_ = fVar16;
      local_c8._0_8_ = lVar27;
      if (0 < (int)(float)local_158) {
        iVar14 = 0;
        lVar26 = lVar27;
        do {
          local_188 = CONCAT44(local_188._4_4_,iVar14);
          if (0 < (int)(float)local_178) {
            uVar37 = 0;
            do {
              if (0 < kernel_h) {
                sVar3 = bottom_blob->cstep;
                sVar4 = bottom_blob->elemsize;
                pvVar34 = bottom_blob->data;
                iVar15 = 0;
                lVar35 = lVar26;
                do {
                  if (0 < kernel_w) {
                    uVar21 = 0;
                    do {
                      *(undefined1 *)((long)__ptr + uVar21 + (long)iVar29) =
                           *(undefined1 *)
                            ((long)pvVar34 +
                            (long)((int)lVar35 + (int)uVar21) + sVar3 * uVar37 * sVar4);
                      uVar21 = uVar21 + 1;
                    } while ((uint)kernel_w != uVar21);
                    iVar29 = iVar29 + (int)uVar21;
                  }
                  iVar15 = iVar15 + 1;
                  lVar35 = lVar35 + (ulong)uVar30;
                } while (iVar15 != kernel_h);
              }
              uVar37 = uVar37 + 1;
            } while (uVar37 != local_178);
          }
          iVar14 = iVar14 + 1;
          lVar26 = lVar26 + uVar42;
        } while ((float)iVar14 != (float)local_158);
      }
      fVar16 = (float)((int)fVar16 + 1);
      lVar27 = lVar27 + local_190;
    } while (fVar16 != local_118);
  }
  uVar30 = uVar9 + 3;
  if (-1 < (int)uVar9) {
    uVar30 = uVar9;
  }
  local_b0 = opt->workspace_allocator;
  local_e8 = (float)((int)local_e8 * (int)(float)local_178 * 4);
  uVar42 = (long)(int)local_e8 + 0xfU & 0xfffffffffffffff0;
  uVar37 = (long)(int)(uVar9 + ((int)uVar30 >> 2) * -3) * uVar42;
  if (uVar37 == 0) {
    local_108 = (int *)0x0;
    local_1c0 = (void *)0x0;
  }
  else {
    if (local_b0 == (Allocator *)0x0) {
      local_1c0 = (void *)0x0;
      local_1a8 = (void *)0x0;
      iVar29 = posix_memalign((void **)&local_1a8,0x10,uVar37 | 4);
      if (iVar29 == 0) {
        local_1c0 = local_1a8;
      }
    }
    else {
      local_1c0 = (void *)(**(code **)(*(long *)local_b0 + 0x10))();
    }
    local_108 = (int *)((long)local_1c0 + uVar37);
    *(undefined4 *)((long)local_1c0 + uVar37) = 1;
  }
  local_190 = CONCAT44(local_190._4_4_,uVar9) & 0xfffffffffffffffc;
  local_138._0_8_ = SEXT48((int)uVar13);
  if (0 < (int)uVar9 >> 2) {
    local_118 = (float)(uVar13 & 0xfffffffe);
    uVar21 = CONCAT44(0,(int)uVar9 >> 2);
    local_128._0_8_ = uVar21;
    lVar26 = local_138._0_8_ * 4;
    local_c8._0_8_ = lVar26;
    lVar27 = (long)__ptr + local_138._0_8_;
    pvVar34 = (void *)((long)__ptr + local_138._0_8_ * 2);
    pvVar36 = (void *)(local_138._0_8_ * 3 + (long)__ptr);
    uVar37 = 0;
    pvVar22 = local_1c0;
    pvVar39 = __ptr;
    do {
      local_158 = pvVar22;
      local_188 = uVar37;
      puVar40 = (undefined1 *)(uVar42 * local_188 + (long)local_1c0);
      if ((int)uVar13 < 2) {
        pvVar22 = (void *)(local_188 * 4 * local_138._0_8_ + (long)__ptr);
        pvVar28 = (void *)((local_188 * 4 + 1) * local_138._0_8_ + (long)__ptr);
        pvVar11 = (void *)((local_188 * 4 + 2) * local_138._0_8_ + (long)__ptr);
        pvVar19 = (void *)((local_188 * 4 + 3) * local_138._0_8_ + (long)__ptr);
        fVar16 = 0.0;
      }
      else {
        lVar35 = 0;
        do {
          puVar33 = puVar40;
          puVar40 = (undefined1 *)((long)local_158 + lVar35 * 4);
          *puVar40 = *(undefined1 *)((long)pvVar39 + lVar35);
          puVar40[1] = *(undefined1 *)((long)pvVar39 + lVar35 + 1);
          puVar40[2] = *(undefined1 *)(lVar27 + lVar35);
          puVar40[3] = *(undefined1 *)(lVar27 + 1 + lVar35);
          puVar40[4] = *(undefined1 *)((long)pvVar34 + lVar35);
          puVar40[5] = *(undefined1 *)((long)pvVar34 + lVar35 + 1);
          puVar40[6] = *(undefined1 *)((long)pvVar36 + lVar35);
          puVar40[7] = *(undefined1 *)((long)pvVar36 + lVar35 + 1);
          lVar18 = lVar35 + 2;
          iVar29 = (int)lVar35;
          lVar35 = lVar18;
          puVar40 = puVar40 + 8;
        } while (iVar29 + 3 < (int)uVar13);
        puVar40 = puVar33 + 8;
        pvVar22 = (void *)((long)pvVar39 + lVar18);
        pvVar28 = (void *)(lVar27 + lVar18);
        pvVar11 = (void *)((long)pvVar34 + lVar18);
        pvVar19 = (void *)(lVar18 + (long)pvVar36);
        fVar16 = local_118;
      }
      if ((int)fVar16 < (int)uVar13) {
        lVar35 = 0;
        do {
          puVar40[lVar35 * 4] = *(undefined1 *)((long)pvVar22 + lVar35);
          puVar40[lVar35 * 4 + 1] = *(undefined1 *)((long)pvVar28 + lVar35);
          puVar40[lVar35 * 4 + 2] = *(undefined1 *)((long)pvVar11 + lVar35);
          puVar40[lVar35 * 4 + 3] = *(undefined1 *)((long)pvVar19 + lVar35);
          lVar35 = lVar35 + 1;
        } while (uVar13 - (int)fVar16 != (int)lVar35);
      }
      pvVar39 = (void *)((long)pvVar39 + lVar26);
      lVar27 = lVar27 + lVar26;
      pvVar34 = (void *)((long)pvVar34 + lVar26);
      pvVar36 = (void *)((long)pvVar36 + lVar26);
      uVar37 = local_188 + 1;
      pvVar22 = (void *)((long)local_158 + uVar42);
    } while (local_188 + 1 != uVar21);
  }
  if ((float)local_190 != (float)uVar9) {
    lVar27 = (long)(int)(float)local_190;
    do {
      puVar40 = (undefined1 *)(lVar27 * local_138._0_8_ + (long)__ptr);
      uVar30 = (uint)lVar27;
      uVar10 = uVar30 + 3;
      if (-1 < (int)uVar30) {
        uVar10 = uVar30;
      }
      puVar33 = (undefined1 *)
                ((long)(int)(((int)uVar10 >> 2) + (uVar30 - (uVar10 & 0xfffffffc))) * uVar42 +
                (long)local_1c0);
      if ((int)uVar13 < 2) {
        uVar30 = 0;
      }
      else {
        iVar29 = 1;
        do {
          *puVar33 = *puVar40;
          puVar33[1] = puVar40[1];
          puVar33 = puVar33 + 2;
          puVar40 = puVar40 + 2;
          iVar29 = iVar29 + 2;
          uVar30 = uVar13 & 0xfffffffe;
        } while (iVar29 < (int)uVar13);
      }
      if ((int)uVar30 < (int)uVar13) {
        lVar26 = 0;
        do {
          puVar33[lVar26] = puVar40[lVar26];
          lVar26 = lVar26 + 1;
        } while (uVar13 - uVar30 != (int)lVar26);
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 < (int)uVar9);
  }
  uVar30 = (uint)local_160;
  uVar10 = uVar30 + 3;
  if (-1 < (int)uVar30) {
    uVar10 = uVar30;
  }
  uVar17 = uVar30 + 3;
  if (-1 < (int)uVar30) {
    uVar17 = uVar30;
  }
  local_38 = opt->workspace_allocator;
  uVar37 = (long)(int)((uVar30 - (uVar17 & 0xfffffffc)) + ((int)uVar10 >> 2)) * uVar42;
  local_198 = uVar42;
  if (uVar37 == 0) {
    local_1b8 = (void *)0x0;
    local_68 = (int *)0x0;
  }
  else {
    if (local_38 == (Allocator *)0x0) {
      local_1b8 = (void *)0x0;
      local_1a8 = (void *)0x0;
      iVar29 = posix_memalign((void **)&local_1a8,0x10,uVar37 | 4);
      if (iVar29 == 0) {
        local_1b8 = local_1a8;
      }
    }
    else {
      local_1b8 = (void *)(**(code **)(*(long *)local_38 + 0x10))();
    }
    local_68 = (int *)((long)local_1b8 + uVar37);
    *(undefined4 *)((long)local_1b8 + uVar37) = 1;
  }
  fVar16 = (float)((int)local_160 >> 2);
  local_a8 = local_160 & 0xfffffffffffffffc;
  local_58 = (ulong)(uint)fVar16;
  if (0 < (int)fVar16) {
    local_188 = CONCAT44(local_188._4_4_,uVar13) & 0xfffffffffffffffe;
    iVar14 = (int)local_178 * kernel_h * kernel_w;
    iVar29 = iVar14 * 3;
    iVar14 = iVar14 * 2;
    iVar15 = 0;
    uVar37 = 0;
    pvVar34 = local_1b8;
    uVar30 = uVar13;
    do {
      puVar40 = (undefined1 *)(uVar42 * uVar37 + (long)local_1b8);
      local_178 = CONCAT44(local_178._4_4_,iVar29);
      if ((int)uVar13 < 2) {
        iVar41 = (int)uVar37;
        lVar26 = (long)&local_d8->data + (long)(int)((iVar41 * 4 + 3) * uVar13);
        lVar27 = (long)&local_d8->data + (long)(int)((iVar41 * 4 + 2) * uVar13);
        lVar18 = (long)&local_d8->data + (long)(int)((iVar41 * 4 + 1) * uVar13);
        lVar35 = (long)&local_d8->data + (long)(int)(iVar41 * 4 * uVar13);
        iVar41 = 0;
      }
      else {
        lVar27 = 0;
        do {
          puVar33 = puVar40;
          puVar40 = (undefined1 *)((long)pvVar34 + lVar27 * 4);
          *puVar40 = *(undefined1 *)((long)&local_d8->data + lVar27 + iVar15);
          puVar40[1] = *(undefined1 *)((long)&local_d8->data + lVar27 + (long)iVar15 + 1);
          puVar40[2] = *(undefined1 *)((long)&local_d8->data + lVar27 + (int)uVar30);
          puVar40[3] = *(undefined1 *)((long)&local_d8->data + lVar27 + (long)(int)uVar30 + 1);
          puVar40[4] = *(undefined1 *)((long)&local_d8->data + lVar27 + iVar14);
          puVar40[5] = *(undefined1 *)((long)&local_d8->data + lVar27 + (long)iVar14 + 1);
          puVar40[6] = *(undefined1 *)((long)&local_d8->data + lVar27 + iVar29);
          puVar40[7] = *(undefined1 *)((long)&local_d8->data + lVar27 + (long)iVar29 + 1);
          lVar35 = lVar27 + 2;
          iVar41 = (int)lVar27;
          lVar27 = lVar35;
          puVar40 = puVar40 + 8;
        } while (iVar41 + 3 < (int)uVar13);
        puVar40 = puVar33 + 8;
        lVar26 = (long)&local_d8->data + lVar35 + iVar29;
        lVar27 = (long)&local_d8->data + lVar35 + iVar14;
        lVar18 = (long)&local_d8->data + lVar35 + (int)uVar30;
        lVar35 = (long)&local_d8->data + lVar35 + iVar15;
        iVar41 = (int)(float)local_188;
      }
      if (iVar41 < (int)uVar13) {
        lVar23 = 0;
        do {
          puVar40[lVar23 * 4] = *(undefined1 *)(lVar35 + lVar23);
          puVar40[lVar23 * 4 + 1] = *(undefined1 *)(lVar18 + lVar23);
          puVar40[lVar23 * 4 + 2] = *(undefined1 *)(lVar27 + lVar23);
          puVar40[lVar23 * 4 + 3] = *(undefined1 *)(lVar26 + lVar23);
          lVar23 = lVar23 + 1;
        } while (uVar13 - iVar41 != (int)lVar23);
      }
      uVar37 = uVar37 + 1;
      pvVar34 = (void *)((long)pvVar34 + local_198);
      iVar29 = iVar29 + (int)local_e8;
      iVar14 = iVar14 + (int)local_e8;
      uVar30 = uVar30 + (int)local_e8;
      iVar15 = iVar15 + (int)local_e8;
      uVar42 = local_198;
    } while (uVar37 != local_58);
  }
  if ((int)local_a8 != (int)local_160) {
    uVar37 = local_a8;
    do {
      uVar30 = (uint)uVar37;
      uVar10 = uVar30 + 3;
      if (-1 < (int)uVar30) {
        uVar10 = uVar30;
      }
      puVar40 = (undefined1 *)
                ((long)(int)(((int)uVar10 >> 2) + (uVar30 - (uVar10 & 0xfffffffc))) * uVar42 +
                (long)local_1b8);
      puVar33 = (undefined1 *)((long)&local_d8->data + (long)(int)(uVar13 * uVar30));
      if ((int)uVar13 < 2) {
        uVar30 = 0;
      }
      else {
        iVar29 = 1;
        do {
          *puVar40 = *puVar33;
          puVar40[1] = puVar33[1];
          puVar40 = puVar40 + 2;
          puVar33 = puVar33 + 2;
          iVar29 = iVar29 + 2;
          uVar30 = uVar13 & 0xfffffffe;
        } while (iVar29 < (int)uVar13);
      }
      if ((int)uVar30 < (int)uVar13) {
        lVar27 = 0;
        do {
          puVar40[lVar27] = puVar33[lVar27];
          lVar27 = lVar27 + 1;
        } while (uVar13 - uVar30 != (int)lVar27);
      }
      uVar37 = uVar37 + 1;
    } while ((long)uVar37 < (long)local_160);
  }
  local_40 = (char *)(ulong)uVar9;
  local_158._0_4_ = fVar16;
  if (0 < (int)fVar16) {
    local_140 = uVar13 & 0xfffffffe;
    uVar37 = 0;
    do {
      lVar27 = uVar37 * 4 + 1;
      lVar26 = uVar37 * 4 + 2;
      lVar35 = uVar37 * 4 + 3;
      if (_bias == (Mat *)0x0) {
        uVar44 = 0;
        fVar16 = 0.0;
        local_158._0_4_ = 0.0;
        uVar48 = 0;
      }
      else {
        fVar16 = *(float *)(&_bias->data + uVar37 * 2);
        local_158._0_4_ = *(float *)((long)&_bias->data + uVar37 * 0x10 + 4);
        uVar44 = *(undefined4 *)(&_bias->refcount + uVar37 * 2);
        uVar48 = *(undefined4 *)((long)&_bias->refcount + uVar37 * 0x10 + 4);
      }
      local_178 = CONCAT44(local_178._4_4_,uVar44);
      sVar3 = local_60->cstep;
      pvVar34 = local_60->data;
      sVar4 = local_60->elemsize;
      local_f0 = (undefined1 *)(uVar37 * 4 * sVar3 * sVar4 + (long)pvVar34);
      puVar33 = (undefined1 *)(sVar3 * lVar27 * sVar4 + (long)pvVar34);
      puVar40 = (undefined1 *)(sVar3 * lVar26 * sVar4 + (long)pvVar34);
      pcVar38 = (char *)(sVar3 * lVar35 * sVar4 + (long)pvVar34);
      pcVar43 = (char *)0x0;
      pfVar5 = (scale_requant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_c8._0_4_ = pfVar5[uVar37 * 8];
      local_138._0_4_ = pfVar5[uVar37 * 8 + 1];
      local_e8 = pfVar5[lVar27 * 2 + 1];
      local_118 = pfVar5[lVar26 * 2];
      local_13c = pfVar5[lVar35 * 2 + 1];
      local_188 = CONCAT44(local_188._4_4_,fVar16);
      local_128._0_4_ = uVar48;
      local_d8 = (Mat *)CONCAT44(local_d8._4_4_,pfVar5[lVar27 * 2]);
      local_190 = CONCAT44(local_190._4_4_,pfVar5[lVar26 * 2 + 1]);
      local_148 = CONCAT44(local_148._4_4_,pfVar5[lVar35 * 2]);
      local_50 = uVar37;
      if (3 < (int)uVar9) {
        local_f8 = (char *)(uVar42 * uVar37 + (long)local_1b8);
        pcVar43 = (char *)0x0;
        do {
          puVar7 = local_f0;
          pvVar34 = (void *)(((ulong)pcVar43 >> 2) * uVar42 + (long)local_1c0);
          local_1a8 = (void *)0x0;
          uStack_1a0 = 0;
          local_98[8] = 0;
          local_98[9] = 0;
          local_98[10] = 0;
          local_98[0xb] = 0;
          local_98[4] = 0;
          local_98[5] = 0;
          local_98[6] = 0;
          local_98[7] = 0;
          local_98[0] = 0;
          local_98[1] = 0;
          local_98[2] = 0;
          local_98[3] = 0;
          pcVar20 = local_f8;
          uVar30 = 0;
          if (1 < (int)uVar13) {
            iVar29 = 0;
            do {
              lVar27 = 0;
              do {
                iVar14 = (int)*(char *)((long)pvVar34 + lVar27) * (int)*pcVar20 +
                         *(int *)((long)&local_1a8 + lVar27 * 2);
                *(int *)((long)&local_1a8 + lVar27 * 2) = iVar14;
                *(int *)((long)&local_1a8 + lVar27 * 2) =
                     (int)*(char *)((long)pvVar34 + lVar27 + 1) * (int)pcVar20[1] + iVar14;
                iVar14 = (int)*(char *)((long)pvVar34 + lVar27) * (int)pcVar20[2] +
                         *(int *)((long)local_98 + lVar27 * 2 + 0x20);
                *(int *)((long)local_98 + lVar27 * 2 + 0x20) = iVar14;
                *(int *)((long)local_98 + lVar27 * 2 + 0x20) =
                     (int)*(char *)((long)pvVar34 + lVar27 + 1) * (int)pcVar20[3] + iVar14;
                iVar14 = (int)*(char *)((long)pvVar34 + lVar27) * (int)pcVar20[4] +
                         *(int *)((long)local_98 + lVar27 * 2 + 0x10);
                *(int *)((long)local_98 + lVar27 * 2 + 0x10) = iVar14;
                *(int *)((long)local_98 + lVar27 * 2 + 0x10) =
                     (int)*(char *)((long)pvVar34 + lVar27 + 1) * (int)pcVar20[5] + iVar14;
                iVar14 = (int)*(char *)((long)pvVar34 + lVar27) * (int)pcVar20[6] +
                         *(int *)((long)local_98 + lVar27 * 2);
                *(int *)((long)local_98 + lVar27 * 2) = iVar14;
                *(int *)((long)local_98 + lVar27 * 2) =
                     (int)*(char *)((long)pvVar34 + lVar27 + 1) * (int)pcVar20[7] + iVar14;
                lVar27 = lVar27 + 2;
              } while (lVar27 != 8);
              pcVar20 = pcVar20 + 8;
              pvVar34 = (void *)((long)pvVar34 + 8);
              iVar14 = iVar29 + 3;
              iVar29 = iVar29 + 2;
              uVar30 = local_140;
            } while (iVar14 < (int)uVar13);
          }
          if ((int)uVar30 < (int)uVar13) {
            do {
              lVar27 = 0;
              do {
                piVar1 = (int *)((long)&local_1a8 + lVar27 * 4);
                *piVar1 = *piVar1 + (int)*(char *)((long)pvVar34 + lVar27) * (int)*pcVar20;
                local_98[lVar27 + 8] =
                     local_98[lVar27 + 8] + (int)*(char *)((long)pvVar34 + lVar27) * (int)pcVar20[1]
                ;
                local_98[lVar27 + 4] =
                     local_98[lVar27 + 4] + (int)*(char *)((long)pvVar34 + lVar27) * (int)pcVar20[2]
                ;
                local_98[lVar27] =
                     local_98[lVar27] + (int)*(char *)((long)pvVar34 + lVar27) * (int)pcVar20[3];
                lVar27 = lVar27 + 1;
              } while (lVar27 != 4);
              pcVar20 = pcVar20 + 4;
              pvVar34 = (void *)((long)pvVar34 + 4);
              uVar30 = uVar30 + 1;
            } while (uVar30 != uVar13);
          }
          lVar27 = 0;
          local_a0 = pcVar43;
          do {
            fVar16 = roundf(((float)*(int *)((long)&local_1a8 + lVar27 * 4) * (float)local_c8._0_4_
                            + fVar16) * (float)local_138._0_4_);
            if (fVar16 <= -128.0) {
              fVar16 = -128.0;
            }
            if (127.0 <= fVar16) {
              fVar16 = 127.0;
            }
            puVar7[lVar27] = (char)(int)fVar16;
            fVar16 = roundf(((float)local_98[lVar27 + 8] * (float)local_d8 + (float)local_158) *
                            local_e8);
            if (fVar16 <= -128.0) {
              fVar16 = -128.0;
            }
            if (127.0 <= fVar16) {
              fVar16 = 127.0;
            }
            puVar33[lVar27] = (char)(int)fVar16;
            fVar16 = roundf(((float)local_98[lVar27 + 4] * local_118 + (float)local_178) *
                            (float)local_190);
            if (fVar16 <= -128.0) {
              fVar16 = -128.0;
            }
            if (127.0 <= fVar16) {
              fVar16 = 127.0;
            }
            puVar40[lVar27] = (char)(int)fVar16;
            fVar16 = roundf(((float)local_98[lVar27] * (float)local_148 + (float)local_128._0_4_) *
                            local_13c);
            if (fVar16 <= -128.0) {
              fVar16 = -128.0;
            }
            if (127.0 <= fVar16) {
              fVar16 = 127.0;
            }
            pcVar38[lVar27] = (char)(int)fVar16;
            lVar27 = lVar27 + 1;
            fVar16 = (float)local_188;
          } while (lVar27 != 4);
          local_f0 = puVar7 + 4;
          puVar33 = puVar33 + 4;
          puVar40 = puVar40 + 4;
          pcVar38 = pcVar38 + 4;
          pcVar43 = local_a0 + 4;
          uVar42 = local_198;
        } while (local_a0 + 7 < local_40);
      }
      if ((int)pcVar43 < (int)uVar9) {
        local_48 = (char *)(uVar42 * local_50 + (long)local_1b8);
        do {
          pcVar12 = (char *)((((uint)pcVar43 & 3) + ((uint)((ulong)pcVar43 >> 2) & 0x3fffffff)) *
                             uVar42 + (long)local_1c0);
          iVar29 = 0;
          pcVar20 = local_48;
          if ((int)uVar13 < 2) {
            iVar15 = 0;
            iVar14 = 0;
            iVar41 = 0;
            uVar30 = 0;
          }
          else {
            iVar41 = 0;
            iVar25 = 1;
            iVar14 = 0;
            iVar15 = 0;
            iVar29 = 0;
            do {
              iVar31 = (int)*pcVar12;
              iVar32 = (int)pcVar12[1];
              iVar29 = pcVar20[1] * iVar32 + *pcVar20 * iVar31 + iVar29;
              iVar15 = pcVar20[3] * iVar32 + pcVar20[2] * iVar31 + iVar15;
              iVar14 = pcVar20[5] * iVar32 + pcVar20[4] * iVar31 + iVar14;
              iVar41 = pcVar20[7] * iVar32 + pcVar20[6] * iVar31 + iVar41;
              pcVar20 = pcVar20 + 8;
              pcVar12 = pcVar12 + 2;
              iVar25 = iVar25 + 2;
              uVar30 = local_140;
            } while (iVar25 < (int)uVar13);
          }
          if ((int)uVar30 < (int)uVar13) {
            lVar27 = 0;
            do {
              iVar25 = (int)pcVar12[lVar27];
              iVar29 = iVar29 + pcVar20[lVar27 * 4] * iVar25;
              iVar15 = iVar15 + pcVar20[lVar27 * 4 + 1] * iVar25;
              iVar14 = iVar14 + pcVar20[lVar27 * 4 + 2] * iVar25;
              iVar41 = iVar41 + pcVar20[lVar27 * 4 + 3] * iVar25;
              lVar27 = lVar27 + 1;
            } while (uVar13 - uVar30 != (int)lVar27);
          }
          local_f8 = pcVar43;
          local_a0 = pcVar38;
          fVar16 = roundf(((float)iVar29 * (float)local_c8._0_4_ + (float)local_188) *
                          (float)local_138._0_4_);
          puVar7 = local_f0;
          if (fVar16 <= -128.0) {
            fVar16 = -128.0;
          }
          if (127.0 <= fVar16) {
            fVar16 = 127.0;
          }
          *local_f0 = (char)(int)fVar16;
          fVar16 = roundf(((float)iVar15 * (float)local_d8 + (float)local_158) * local_e8);
          if (fVar16 <= -128.0) {
            fVar16 = -128.0;
          }
          if (127.0 <= fVar16) {
            fVar16 = 127.0;
          }
          *puVar33 = (char)(int)fVar16;
          fVar16 = roundf(((float)iVar14 * local_118 + (float)local_178) * (float)local_190);
          if (fVar16 <= -128.0) {
            fVar16 = -128.0;
          }
          if (127.0 <= fVar16) {
            fVar16 = 127.0;
          }
          *puVar40 = (char)(int)fVar16;
          fVar16 = roundf(((float)iVar41 * (float)local_148 + (float)local_128._0_4_) * local_13c);
          if (fVar16 <= -128.0) {
            fVar16 = -128.0;
          }
          if (127.0 <= fVar16) {
            fVar16 = 127.0;
          }
          *local_a0 = (char)(int)fVar16;
          local_f0 = puVar7 + 1;
          puVar33 = puVar33 + 1;
          puVar40 = puVar40 + 1;
          pcVar38 = local_a0 + 1;
          uVar30 = (int)local_f8 + 1;
          pcVar43 = (char *)(ulong)uVar30;
          uVar42 = local_198;
        } while (uVar30 != uVar9);
      }
      uVar37 = local_50 + 1;
    } while (uVar37 != local_58);
  }
  if ((int)local_a8 != (int)local_160) {
    local_190 = CONCAT44(local_190._4_4_,uVar13) & 0xfffffffffffffffe;
    lVar27 = (long)(int)local_a8;
    do {
      if (_bias == (Mat *)0x0) {
        auVar45 = ZEXT812(0);
      }
      else {
        auVar45._4_8_ = 0;
        auVar45._0_4_ = *(uint *)((long)&_bias->data + lVar27 * 4);
      }
      auVar47._12_4_ = 0;
      auVar47._0_12_ = auVar45;
      puVar24 = (undefined4 *)(local_60->cstep * lVar27 * local_60->elemsize + (long)local_60->data)
      ;
      uVar42 = 0;
      pfVar5 = (scale_requant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      fVar16 = pfVar5[lVar27 * 2];
      local_c8 = ZEXT416((uint)fVar16);
      fVar2 = pfVar5[lVar27 * 2 + 1];
      local_138 = ZEXT416((uint)fVar2);
      local_148 = lVar27;
      local_128 = auVar47;
      if (3 < (int)uVar9) {
        uVar30 = (uint)lVar27;
        uVar10 = uVar30 + 3;
        if (-1 < (int)uVar30) {
          uVar10 = uVar30;
        }
        pcVar43 = (char *)((long)(int)(((int)uVar10 >> 2) + (uVar30 - (uVar10 & 0xfffffffc))) *
                           local_198 + (long)local_1b8);
        local_d8 = (Mat *)CONCAT44(fVar16,fVar16);
        local_128._0_4_ = auVar45._0_4_;
        local_e8 = (float)local_128._0_4_;
        fStack_e4 = (float)local_128._0_4_;
        fStack_e0 = (float)local_128._0_4_;
        fStack_dc = (float)local_128._0_4_;
        uVar37 = 0;
        local_118 = fVar2;
        fStack_114 = fVar2;
        fStack_110 = fVar2;
        fStack_10c = fVar2;
        fStack_d0 = fVar16;
        fStack_cc = fVar16;
        do {
          pvVar34 = (void *)((uVar37 >> 2) * local_198 + (long)local_1c0);
          uVar30 = 0;
          local_1a8 = (void *)0x0;
          uStack_1a0 = 0;
          pcVar38 = pcVar43;
          if (1 < (int)uVar13) {
            iVar29 = 0;
            do {
              lVar27 = 0;
              do {
                iVar14 = (int)*(char *)((long)pvVar34 + lVar27 * 2) * (int)*pcVar38 +
                         *(int *)((long)&local_1a8 + lVar27 * 4);
                *(int *)((long)&local_1a8 + lVar27 * 4) = iVar14;
                *(int *)((long)&local_1a8 + lVar27 * 4) =
                     (int)*(char *)((long)pvVar34 + lVar27 * 2 + 1) * (int)pcVar38[1] + iVar14;
                lVar27 = lVar27 + 1;
              } while (lVar27 != 4);
              pcVar38 = pcVar38 + 2;
              pvVar34 = (void *)((long)pvVar34 + 8);
              iVar14 = iVar29 + 3;
              iVar29 = iVar29 + 2;
            } while (iVar14 < (int)uVar13);
            uVar30 = (uint)(float)local_190;
          }
          if ((int)uVar30 < (int)uVar13) {
            do {
              lVar27 = 0;
              do {
                piVar1 = (int *)((long)&local_1a8 + lVar27 * 4);
                *piVar1 = *piVar1 + (int)*(char *)((long)pvVar34 + lVar27) * (int)*pcVar38;
                lVar27 = lVar27 + 1;
              } while (lVar27 != 4);
              pcVar38 = pcVar38 + 1;
              pvVar34 = (void *)((long)pvVar34 + 4);
              uVar30 = uVar30 + 1;
            } while (uVar30 != uVar13);
          }
          fStack_170 = ((float)(int)uStack_1a0 * fStack_d0 + fStack_e0) * fStack_110;
          fStack_16c = ((float)uStack_1a0._4_4_ * fStack_cc + fStack_dc) * fStack_10c;
          local_178 = CONCAT44(((float)local_1a8._4_4_ * local_d8._4_4_ + fStack_e4) * fStack_114,
                               ((float)(int)local_1a8 * (float)local_d8 + local_e8) * local_118);
          local_188._0_4_ = roundf(fStack_16c);
          local_188._4_4_ = extraout_XMM0_Db;
          fVar16 = roundf(fStack_170);
          uStack_17c = local_188._4_4_;
          local_188 = CONCAT44((float)local_188,fVar16);
          local_158._0_4_ = roundf((float)local_178);
          local_158._4_4_ = extraout_XMM0_Db_00;
          fVar16 = roundf(local_178._4_4_);
          auVar46._0_4_ = (int)(float)local_158;
          auVar46._4_4_ = (int)fVar16;
          auVar46._8_4_ = (int)(float)local_188;
          auVar46._12_4_ = (int)(float)(local_188 >> 0x20);
          auVar47 = packssdw(auVar46,auVar46);
          auVar47 = packsswb(auVar47,auVar47);
          *puVar24 = auVar47._0_4_;
          puVar24 = puVar24 + 1;
          uVar42 = uVar37 + 4;
          pcVar38 = (char *)(uVar37 + 7);
          uVar37 = uVar42;
        } while (pcVar38 < local_40);
      }
      if ((int)uVar42 < (int)uVar9) {
        uVar30 = (uint)local_148;
        uVar10 = uVar30 + 3;
        if (-1 < (int)uVar30) {
          uVar10 = uVar30;
        }
        lVar27 = (long)(int)(((int)uVar10 >> 2) + (uVar30 - (uVar10 & 0xfffffffc))) * local_198;
        do {
          if ((int)uVar13 < 1) {
            fVar16 = 0.0;
          }
          else {
            lVar26 = 0;
            iVar29 = 0;
            do {
              iVar29 = iVar29 + (int)*(char *)((long)local_1c0 +
                                              lVar26 + (((uint)uVar42 & 3) +
                                                       ((uint)(uVar42 >> 2) & 0x3fffffff)) *
                                                       local_198) *
                                (int)*(char *)((long)local_1b8 + lVar26 + lVar27);
              lVar26 = lVar26 + 1;
            } while (uVar13 != (uint)lVar26);
            fVar16 = (float)iVar29;
          }
          fVar16 = roundf((fVar16 * (float)local_c8._0_4_ + (float)local_128._0_4_) *
                          (float)local_138._0_4_);
          if (fVar16 <= -128.0) {
            fVar16 = -128.0;
          }
          if (127.0 <= fVar16) {
            fVar16 = 127.0;
          }
          *(char *)puVar24 = (char)(int)fVar16;
          puVar24 = (undefined4 *)((long)puVar24 + 1);
          uVar30 = (uint)uVar42 + 1;
          uVar42 = (ulong)uVar30;
        } while (uVar30 != uVar9);
      }
      lVar27 = local_148 + 1;
    } while (lVar27 < (long)local_160);
  }
  pAVar8 = local_b0;
  piVar6 = local_100;
  piVar1 = local_108;
  if (local_68 != (int *)0x0) {
    LOCK();
    *local_68 = *local_68 + -1;
    UNLOCK();
    if (*local_68 == 0) {
      if (local_38 == (Allocator *)0x0) {
        if (local_1b8 != (void *)0x0) {
          free(local_1b8);
        }
      }
      else {
        (**(code **)(*(long *)local_38 + 0x18))(local_38,local_1b8);
      }
    }
  }
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (pAVar8 == (Allocator *)0x0) {
        if (local_1c0 != (void *)0x0) {
          free(local_1c0);
        }
      }
      else {
        (**(code **)(*(long *)pAVar8 + 0x18))(pAVar8,local_1c0);
      }
    }
  }
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_b8 == (Allocator *)0x0) {
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
      }
      else {
        (**(code **)(*(long *)local_b8 + 0x18))(local_b8,__ptr);
      }
    }
  }
  return;
}

Assistant:

static void conv_im2col_sgemm_int8_requant_sse(const Mat &bottom_blob, Mat &top_blob, const Mat &_kernel, \
            const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Mat &_bias, std::vector<float> scale_requant, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char *kernel = _kernel;
    const float* bias = _bias;

    // im2row
    Mat bottom_im2row(kernel_h*kernel_w*inch, outw*outh, 1UL, opt.workspace_allocator);
    {
        signed char* ret = (signed char*)bottom_im2row;
        int retID = 0;
    
        for (int i=0; i<outh; i++)
        {
            for (int j=0; j<outw; j++)
            {
                for (int p=0; p<inch; p++)
                {
                    const signed char* input = bottom_blob.channel(p);
                    for (int u=0; u<kernel_h; u++)
                    {
                        for (int v=0; v<kernel_w; v++)
                        {    
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }                
                }
            }
        }
    }    

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // int M = outch;  // outch
    int N = outw * outh; // outsize or out stride
    int K = kernel_w * kernel_h * inch; // ksize * inch

    // bottom_im2row memory packed 4 x 4
    Mat bottom_tm(4*kernel_size, inch, out_size/4 + out_size%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii=0; ii<nn_size; ii++)
        {
            int i = ii * 4;

            const signed char* img0 = bottom_im2row.row<signed char>(i);
            const signed char* img1 = bottom_im2row.row<signed char>(i+1);
            const signed char* img2 = bottom_im2row.row<signed char>(i+2);
            const signed char* img3 = bottom_im2row.row<signed char>(i+3);

            signed char* tmpptr = bottom_tm.channel(i/4);

            int q = 0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img1[0];
                tmpptr[3] = img1[1];
                tmpptr[4] = img2[0];
                tmpptr[5] = img2[1];
                tmpptr[6] = img3[0];
                tmpptr[7] = img3[1];

                tmpptr += 8;
                img0 += 2;
                img1 += 2;
                img2 += 2;
                img3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img1[0];
                tmpptr[2] = img2[0];
                tmpptr[3] = img3[0];

                tmpptr += 4;
                img0 += 1;
                img1 += 1;
                img2 += 1;
                img3 += 1;                
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_size_start; i<out_size; i++)
        {
            const signed char* img0 = bottom_im2row.row<signed char>(i);

            signed char* tmpptr = bottom_tm.channel(i/4 + i%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];

                tmpptr += 2;
                img0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += 1;
            }
        }       
    }

    // kernel memory packed 4 x 4
    Mat kernel_tm(4*kernel_size, inch, outch/4 + outch%4, (size_t)1u, opt.workspace_allocator);
    {
        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int p = pp * 4;

            const signed char* k0 = kernel + (p+0)*inch*kernel_size;
            const signed char* k1 = kernel + (p+1)*inch*kernel_size;
            const signed char* k2 = kernel + (p+2)*inch*kernel_size;
            const signed char* k3 = kernel + (p+3)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4);

            int q=0;
            for (; q+1<inch*kernel_size; q+=2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp[2] = k1[0];
                ktmp[3] = k1[1];
                ktmp[4] = k2[0];
                ktmp[5] = k2[1];
                ktmp[6] = k3[0];
                ktmp[7] = k3[1];

                ktmp += 8;

                k0 += 2;
                k1 += 2;
                k2 += 2;
                k3 += 2;
            }

            for (; q<inch*kernel_size; q++)
            { 
                ktmp[0] = k0[0];
                ktmp[1] = k1[0];
                ktmp[2] = k2[0];
                ktmp[3] = k3[0];
                ktmp += 4;

                k0 += 1;
                k1 += 1;
                k2 += 1;
                k3 += 1;
            }           
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=remain_outch_start; p<outch; p++)
        {
            const signed char* k0 = kernel + (p+0)*inch*kernel_size;

            signed char* ktmp = kernel_tm.channel(p/4 + p%4);

            int q=0;
            for (; q+1<inch*kernel_size; q=q+2)
            {
                ktmp[0] = k0[0];
                ktmp[1] = k0[1];
                ktmp += 2;
                k0 += 2;
            }

            for (; q<inch*kernel_size; q++)
            {
                ktmp[0] = k0[0];
                ktmp++;
                k0++;
            }
        }
    }    

    // 4x4
    // sgemm(int M, int N, int K, float* A, float* B, float* C)
    {
        // int M = outch;  // outch
        // int N = outw * outh; // outsize or out stride
        // int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int i = pp * 4;

            signed char* output0 = top_blob.channel(i);
            signed char* output1 = top_blob.channel(i+1);
            signed char* output2 = top_blob.channel(i+2);
            signed char* output3 = top_blob.channel(i+3);

            const float bias0 = bias ? bias[i] : 0.f;
            const float bias1 = bias ? bias[i+1] : 0.f;
            const float bias2 = bias ? bias[i+2] : 0.f;
            const float bias3 = bias ? bias[i+3] : 0.f;

            const float scale_requant_in0  = scale_requant[2*i];
            const float scale_requant_out0 = scale_requant[2*i+1];
            const float scale_requant_in1  = scale_requant[2*(i+1)];
            const float scale_requant_out1 = scale_requant[2*(i+1)+1];
            const float scale_requant_in2  = scale_requant[2*(i+2)];
            const float scale_requant_out2 = scale_requant[2*(i+2)+1];
            const float scale_requant_in3  = scale_requant[2*(i+3)];
            const float scale_requant_out3 = scale_requant[2*(i+3)+1];

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4);
                
                int sum0[4] = {0};
                int sum1[4] = {0};
                int sum2[4] = {0};
                int sum3[4] = {0};
               
                int k=0;

                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[2*n];   // k0
                        sum0[n] += (int)va[1] * vb[2*n+1];

                        sum1[n] += (int)va[2] * vb[2*n];   // k1
                        sum1[n] += (int)va[3] * vb[2*n+1];

                        sum2[n] += (int)va[4] * vb[2*n];   // k2
                        sum2[n] += (int)va[5] * vb[2*n+1];

                        sum3[n] += (int)va[6] * vb[2*n];   // k3
                        sum3[n] += (int)va[7] * vb[2*n+1];
                    }

                    va += 8;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += (int)va[0] * vb[n];
                        sum1[n] += (int)va[1] * vb[n];
                        sum2[n] += (int)va[2] * vb[n];
                        sum3[n] += (int)va[3] * vb[n];
                    }
                    
                    va += 4;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output0[n] = float2int8(((float)sum0[n] * scale_requant_in0 + bias0) * scale_requant_out0);
                    output1[n] = float2int8(((float)sum1[n] * scale_requant_in1 + bias1) * scale_requant_out1);
                    output2[n] = float2int8(((float)sum2[n] * scale_requant_in2 + bias2) * scale_requant_out2);
                    output3[n] = float2int8(((float)sum3[n] * scale_requant_in3 + bias3) * scale_requant_out3);
                }
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j<N; j++)
            {                
                int sum0 = 0;
                int sum1 = 0;
                int sum2 = 0;
                int sum3 = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4);

                int k=0;

                for (; k+1<K; k=k+2)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum0 += (int)va[1] * vb[1];

                    sum1 += (int)va[2] * vb[0];
                    sum1 += (int)va[3] * vb[1];

                    sum2 += (int)va[4] * vb[0];
                    sum2 += (int)va[5] * vb[1];

                    sum3 += (int)va[6] * vb[0];
                    sum3 += (int)va[7] * vb[1];

                    va += 8;
                    vb += 2;
                }

                for (; k<K; k++)
                {
                    sum0 += (int)va[0] * vb[0];
                    sum1 += (int)va[1] * vb[0];
                    sum2 += (int)va[2] * vb[0];
                    sum3 += (int)va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }
                
                output0[0] = float2int8(((float)sum0 * scale_requant_in0 + bias0) * scale_requant_out0);
                output1[0] = float2int8(((float)sum1 * scale_requant_in1 + bias1) * scale_requant_out1);
                output2[0] = float2int8(((float)sum2 * scale_requant_in2 + bias2) * scale_requant_out2);
                output3[0] = float2int8(((float)sum3 * scale_requant_in3 + bias3) * scale_requant_out3);

                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_outch_start; i<outch; i++)
        {
            signed char* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;

            const float scale_requant_in0  = scale_requant[2*i];
            const float scale_requant_out0 = scale_requant[2*i+1];            

            int j=0;
            for (; j+3<N; j=j+4)
            {
                signed char* vb = bottom_tm.channel(j/4);
                signed char* va = kernel_tm.channel(i/4 + i%4);
                int sum[4] = {0};

                int k=0;
                for (; k+1<K; k=k+2)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[2*n];
                        sum[n] += (int)va[1] * vb[2*n+1];
                    }
                    va += 2;
                    vb += 8;
                }

                for (; k<K; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += (int)va[0] * vb[n];
                    }
                    va += 1;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output[n] = float2int8(((float)sum[n] * scale_requant_in0 + bias0) * scale_requant_out0);
                }
                output += 4;
            }

            for (; j<N; j++)
            {
                int sum = 0;

                signed char* vb = bottom_tm.channel(j/4 + j%4);
                signed char* va = kernel_tm.channel(i/4 + i%4);

                for (int k=0; k<K; k++)
                {
                    sum += (int)va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = float2int8(((float)sum * scale_requant_in0 + bias0) * scale_requant_out0);

                output++;
            }
        }
    }

    // // sgemm(int M, int N, int K, float* A, float* B, float* C)
    // {
    //     for (int i=0; i<M; i++)
    //     {
    //         int* output = top_blob.channel(i);

    //         for (int j=0; j<N; j++)
    //         {
    //             int sum = 0;

    //             signed char* vb = (signed char*)bottom_im2row + K * j;
    //             const signed char* va = kernel + K * i;

    //             for (int k=0; k<K; k++)
    //             {
    //                 sum += (int)va[0] * vb[0];

    //                 va += 1;
    //                 vb += 1;
    //             }
    //             output[0] = sum;

    //             output++;
    //         }
    //     }
    // }
}